

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void program_unref(MOJOSHADER_glProgram *program)

{
  if (program != (MOJOSHADER_glProgram *)0x0) {
    if (program->refcount < 2) {
      (*ctx->profileDeleteProgram)(program->handle);
      shader_unref(program->vertex);
      shader_unref(program->fragment);
      Free(program->vs_uniforms_float4);
      Free(program->vs_uniforms_int4);
      Free(program->vs_uniforms_bool);
      Free(program->ps_uniforms_float4);
      Free(program->ps_uniforms_int4);
      Free(program->ps_uniforms_bool);
      Free(program->uniforms);
      Free(program->attributes);
      (*ctx->free_fn)(program,ctx->malloc_data);
      return;
    }
    program->refcount = program->refcount - 1;
  }
  return;
}

Assistant:

static void program_unref(MOJOSHADER_glProgram *program)
{
    if (program != NULL)
    {
        const uint32 refcount = program->refcount;
        if (refcount > 1)
            program->refcount--;
        else
        {
            ctx->profileDeleteProgram(program->handle);
            shader_unref(program->vertex);
            shader_unref(program->fragment);
            Free(program->vs_uniforms_float4);
            Free(program->vs_uniforms_int4);
            Free(program->vs_uniforms_bool);
            Free(program->ps_uniforms_float4);
            Free(program->ps_uniforms_int4);
            Free(program->ps_uniforms_bool);
            Free(program->uniforms);
            Free(program->attributes);
            Free(program);
        } // else
    } // if
}